

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

void ssh1_channel_init(ssh1_channel *c)

{
  ssh1_connection_state *psVar1;
  uint uVar2;
  
  psVar1 = c->connlayer;
  c->closes = 0;
  c->pending_eof = false;
  c->throttling_conn = false;
  (c->sc).vt = &ssh1channel_vtable;
  (c->sc).cl = &psVar1->cl;
  uVar2 = alloc_channel_id_general(psVar1->channels,0xc);
  c->localid = uVar2;
  add234(psVar1->channels,c);
  return;
}

Assistant:

void ssh1_channel_init(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    c->closes = 0;
    c->pending_eof = false;
    c->throttling_conn = false;
    c->sc.vt = &ssh1channel_vtable;
    c->sc.cl = &s->cl;
    c->localid = alloc_channel_id(s->channels, struct ssh1_channel);
    add234(s->channels, c);
}